

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_list.cpp
# Opt level: O1

void __thiscall
duckdb::LogicalDependencyList::VerifyDependencies
          (LogicalDependencyList *this,Catalog *catalog,string *name)

{
  AttachedDatabase *pAVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *__n;
  pointer pcVar3;
  int iVar4;
  DependencyException *this_00;
  _Hash_node_base *p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  p_Var5 = (this->set)._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    pAVar1 = catalog->db;
    p_Var2 = (_Hash_node_base *)(pAVar1->super_CatalogEntry).name._M_string_length;
    do {
      __n = p_Var5[0xb]._M_nxt;
      if (__n != p_Var2) {
LAB_0122b786:
        this_00 = (DependencyException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "Error adding dependency for object \"%s\" - dependency \"%s\" is in catalog \"%s\", which does not match the catalog \"%s\".\nCross catalog dependencies are not supported."
                   ,"");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        pcVar3 = (name->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar3,pcVar3 + name->_M_string_length);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,p_Var5[6]._M_nxt,
                   (long)&(p_Var5[6]._M_nxt)->_M_nxt + (long)&(p_Var5[7]._M_nxt)->_M_nxt);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,p_Var5[10]._M_nxt,
                   (long)&(p_Var5[10]._M_nxt)->_M_nxt + (long)&(p_Var5[0xb]._M_nxt)->_M_nxt);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        pcVar3 = (catalog->db->super_CatalogEntry).name._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,pcVar3,
                   pcVar3 + (catalog->db->super_CatalogEntry).name._M_string_length);
        DependencyException::
        DependencyException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (this_00,&local_50,&local_70,&local_90,&local_b0,&local_d0);
        __cxa_throw(this_00,&DependencyException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (__n != (_Hash_node_base *)0x0) {
        iVar4 = bcmp(p_Var5[10]._M_nxt,(pAVar1->super_CatalogEntry).name._M_dataplus._M_p,
                     (size_t)__n);
        if (iVar4 != 0) goto LAB_0122b786;
      }
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void LogicalDependencyList::VerifyDependencies(Catalog &catalog, const string &name) {
	for (auto &dep : set) {
		if (dep.catalog != catalog.GetName()) {
			throw DependencyException(
			    "Error adding dependency for object \"%s\" - dependency \"%s\" is in catalog "
			    "\"%s\", which does not match the catalog \"%s\".\nCross catalog dependencies are not supported.",
			    name, dep.entry.name, dep.catalog, catalog.GetName());
		}
	}
}